

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O2

asn_dec_rval_t
SET_OF_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 char *opt_mname,void *buf_ptr,size_t size)

{
  short *psVar1;
  short sVar2;
  asn_TYPE_member_s *paVar3;
  int *piVar4;
  int iVar5;
  xer_check_tag_e xVar6;
  long lVar7;
  ssize_t sVar8;
  void **ppvVar10;
  size_t num;
  size_t sVar11;
  asn_dec_rval_t aVar12;
  undefined8 uStack_70;
  char *local_68;
  asn_anonymous_set_ *list;
  pxer_chunk_type_e ch_type;
  char *local_48;
  asn_codec_ctx_t *local_40;
  int *local_38;
  size_t sVar9;
  
  local_48 = opt_mname;
  if (opt_mname == (char *)0x0) {
    local_48 = td->xml_tag;
  }
  paVar3 = td->elements;
  piVar4 = (int *)td->specifics;
  list = (asn_anonymous_set_ *)*struct_ptr;
  local_40 = opt_codec_ctx;
  if (list == (asn_anonymous_set_ *)0x0) {
    list = (asn_anonymous_set_ *)calloc(1,(long)*piVar4);
    *struct_ptr = list;
    if (list == (asn_anonymous_set_ *)0x0) {
      uStack_70 = 2;
      sVar11 = 0;
      goto LAB_0014567c;
    }
  }
  if (piVar4[2] == 0) {
    local_68 = paVar3->name;
    if (*local_68 == '\0') {
      local_68 = paVar3->type->xml_tag;
    }
  }
  else {
    local_68 = (char *)0x0;
    if (piVar4[2] != 1) {
      local_68 = "";
    }
  }
  lVar7 = (long)piVar4[1];
  psVar1 = (short *)((long)&list->array + lVar7);
  ppvVar10 = (void **)((long)&list->count + lVar7);
  local_38 = (int *)((long)&list->array + lVar7 + 4);
  sVar11 = 0;
LAB_00145560:
  do {
    if (2 < *psVar1) break;
    if (*psVar1 == 2) {
      aVar12 = (*paVar3->type->xer_decoder)(local_40,paVar3->type,ppvVar10,local_68,buf_ptr,size);
      sVar9 = aVar12.consumed;
      uStack_70 = aVar12._0_8_;
      if (aVar12.code != RC_OK) {
        sVar11 = sVar11 + sVar9;
        goto LAB_0014567c;
      }
      iVar5 = asn_set_add(list,*ppvVar10);
      if (iVar5 != 0) goto LAB_00145679;
      psVar1[4] = 0;
      psVar1[5] = 0;
      psVar1[6] = 0;
      psVar1[7] = 0;
      buf_ptr = (void *)((long)buf_ptr + sVar9);
      size = size - sVar9;
      sVar11 = sVar11 + sVar9;
      *psVar1 = 1;
    }
    sVar8 = xer_next_token(local_38,buf_ptr,size,&ch_type);
    if (sVar8 == -1) goto LAB_00145679;
    if (1 < ch_type - PXER_TEXT) {
      if (ch_type == PXER_WMORE) {
        uStack_70 = 1;
        goto LAB_0014567c;
      }
      xVar6 = xer_check_tag(buf_ptr,(int)sVar8,local_48);
      if (6 < xVar6 - XCT_OPENING) break;
      sVar2 = *psVar1;
      switch(xVar6) {
      case XCT_OPENING:
        if (sVar2 != 1) {
          if (sVar2 != 0) goto switchD_00145628_caseD_4;
          buf_ptr = (void *)((long)buf_ptr + sVar8);
          size = size - sVar8;
          sVar11 = sVar11 + sVar8;
          *psVar1 = 1;
          goto LAB_00145560;
        }
        break;
      case XCT_CLOSING:
        if (sVar2 != 0) {
LAB_00145692:
          sVar11 = sVar11 + sVar8;
          *psVar1 = 3;
          uStack_70 = 0;
          goto LAB_0014567c;
        }
        goto switchD_00145628_caseD_4;
      case XCT_BOTH:
        if (sVar2 != 1) {
          if (sVar2 == 0) goto LAB_00145692;
          goto switchD_00145628_caseD_4;
        }
        break;
      default:
        goto switchD_00145628_caseD_4;
      case XCT_UNKNOWN_OP:
      case XCT_UNKNOWN_BO:
        if (sVar2 != 1) goto switchD_00145628_caseD_4;
      }
      *psVar1 = 2;
      goto LAB_00145560;
    }
    buf_ptr = (void *)((long)buf_ptr + sVar8);
    size = size - sVar8;
    sVar11 = sVar11 + sVar8;
  } while( true );
switchD_00145628_caseD_4:
  *psVar1 = 3;
LAB_00145679:
  uStack_70 = 2;
LAB_0014567c:
  aVar12.consumed = sVar11;
  aVar12._0_8_ = uStack_70;
  return aVar12;
}

Assistant:

asn_dec_rval_t
SET_OF_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *element = td->elements;
	const char *elm_tag;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * ... and parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value from a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/* Which tag is expected for the downstream */
	if(specs->as_XMLValueList) {
		elm_tag = (specs->as_XMLValueList == 1) ? 0 : "";
	} else {
		elm_tag = (*element->name)
				? element->name : element->type->xml_tag;
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);

	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 */
	for(; ctx->phase <= 2;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */

		/*
		 * Go inside the inner member of a set.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;

			/* Invoke the inner type decoder, m.b. multiple times */
			ASN_DEBUG("XER/SET OF element [%s]", elm_tag);
			tmprval = element->type->xer_decoder(opt_codec_ctx,
					element->type, &ctx->ptr, elm_tag,
					buf_ptr, size);
			if(tmprval.code == RC_OK) {
				asn_anonymous_set_ *list = _A_SET_FROM_VOID(st);
				if(ASN_SET_ADD(list, ctx->ptr) != 0)
					RETURN(RC_FAIL);
				ctx->ptr = 0;
				XER_ADVANCE(tmprval.consumed);
			} else {
				XER_ADVANCE(tmprval.consumed);
				RETURN(tmprval.code);
			}
			ctx->phase = 1;	/* Back to body processing */
			ASN_DEBUG("XER/SET OF phase => %d", ctx->phase);
			/* Fall through */
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context,
			buf_ptr, size, &ch_type);
		if(ch_size == -1) {
            RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
            case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/SET OF: tcv = %d, ph=%d t=%s",
			tcv, ctx->phase, xml_tag);
		switch(tcv) {
		case XCT_CLOSING:
			if(ctx->phase == 0) break;
			ctx->phase = 0;
			/* Fall through */
		case XCT_BOTH:
			if(ctx->phase == 0) {
				/* No more things to decode */
				XER_ADVANCE(ch_size);
				ctx->phase = 3;	/* Phase out */
				RETURN(RC_OK);
			}
			/* Fall through */
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			ASN_DEBUG("XER/SET OF: tcv=%d, ph=%d", tcv, ctx->phase);
			if(ctx->phase == 1) {
				/*
				 * Process a single possible member.
				 */
				ctx->phase = 2;
				continue;
			}
			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag in SET OF");
		break;
	}

	ctx->phase = 3;	/* "Phase out" on hard failure */
	RETURN(RC_FAIL);
}